

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  TidyParserMemory *pTVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Dict *pDVar4;
  Bool BVar5;
  uint uVar6;
  Node *pNVar7;
  Node *node;
  Node **ppNVar8;
  uint code;
  int iVar9;
  Node *local_68;
  undefined8 uStack_48;
  
  if (list == (Node *)0x0) {
    uVar6 = (doc->stack).top;
    pTVar1 = (doc->stack).content;
    list = pTVar1[uVar6].original_node;
    node = pTVar1[uVar6].reentry_node;
    iVar9 = pTVar1[uVar6].reentry_state;
    (doc->stack).top = uVar6 - 1;
  }
  else {
    node = (Node *)0x0;
    iVar9 = 0;
  }
  if ((list->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  pLVar2 = doc->lexer;
  pLVar2->insert = (IStack *)0x0;
  local_68 = (Node *)0x0;
LAB_00138ac8:
  do {
    do {
      if (iVar9 != 0) {
        if (iVar9 != 1) {
          if (iVar9 != 2) {
            do {
            } while( true );
          }
          code = 0x25a;
          goto LAB_00138d51;
        }
        pLVar2->excludeBlocks = yes;
        iVar9 = 0;
        if ((local_68 != (Node *)0x0) && (local_68->last == node)) {
          list = prvTidyInferredTag(doc,TidyTag_DL);
          pNVar7 = node->parent;
          list->parent = pNVar7;
          if ((pNVar7 == (Node *)0x0) || (pNVar7->last != node)) {
            pNVar7 = node->next;
            list->next = pNVar7;
            if (pNVar7 != (Node *)0x0) {
              ppNVar8 = &pNVar7->prev;
              goto LAB_00138d2a;
            }
          }
          else {
            ppNVar8 = &pNVar7->last;
LAB_00138d2a:
            *ppNVar8 = list;
          }
          node->next = list;
          list->prev = node;
          iVar9 = 0;
        }
        goto LAB_00138ac8;
      }
      pNVar7 = prvTidyGetToken(doc,IgnoreWhitespace);
      iVar9 = 2;
      node = (Node *)0x0;
    } while (pNVar7 == (Node *)0x0);
    if ((pNVar7->tag == list->tag) && (pNVar7->type == EndTag)) {
      prvTidyFreeNode(doc,pNVar7);
      list->closed = yes;
      return (Node *)0x0;
    }
    BVar5 = InsertMisc(list,pNVar7);
    iVar9 = 0;
    node = pNVar7;
  } while (BVar5 != no);
  BVar5 = prvTidynodeIsText(pNVar7);
  if (BVar5 != no) {
    prvTidyUngetToken(doc);
    node = prvTidyInferredTag(doc,TidyTag_DT);
    prvTidyReport(doc,list,node,0x261);
  }
  pDVar3 = node->tag;
  if (pDVar3 != (Dict *)0x0) {
    if (node->type == EndTag) {
      pNVar7 = list;
      if (pDVar3->id == TidyTag_FORM) {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
        iVar9 = 0;
        prvTidyReport(doc,list,node,0x235);
        prvTidyFreeNode(doc,node);
        goto LAB_00138ac8;
      }
      while (pNVar7 = pNVar7->parent, pNVar7 != (Node *)0x0) {
        pDVar4 = pNVar7->tag;
        if ((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_BODY)) {
          iVar9 = 0;
          prvTidyReport(doc,list,node,0x235);
          prvTidyFreeNode(doc,node);
          local_68 = pNVar7;
          goto LAB_00138ac8;
        }
        if (pDVar3 == pDVar4) {
          prvTidyReport(doc,list,node,0x259);
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
      }
      local_68 = (Node *)0x0;
      if (node != (Node *)0x0) goto LAB_00138c74;
switchD_00138c88_caseD_1:
      prvTidyUngetToken(doc);
      uVar6 = node->tag->model;
      if ((uVar6 & 0x18) == 0) {
        code = 0x27e;
LAB_00138d51:
        prvTidyReport(doc,list,node,code);
        return (Node *)0x0;
      }
      if (((uVar6 & 0x10) == 0) && (pLVar2->excludeBlocks != no)) {
        return (Node *)0x0;
      }
      node = prvTidyInferredTag(doc,TidyTag_DD);
      prvTidyReport(doc,list,node,0x261);
    }
    else {
LAB_00138c74:
      uVar6 = pDVar3->id - TidyTag_CENTER;
      switch(uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f) {
      case 0:
        if (list->content == (Node *)0x0) {
          prvTidyInsertNodeBeforeElement(list,node);
        }
        else {
          pNVar7 = list->parent;
          node->parent = pNVar7;
          if ((pNVar7 == (Node *)0x0) || (pNVar7->last != list)) {
            pNVar7 = list->next;
            node->next = pNVar7;
            if (pNVar7 != (Node *)0x0) {
              ppNVar8 = &pNVar7->prev;
              goto LAB_00138e73;
            }
          }
          else {
            ppNVar8 = &pNVar7->last;
LAB_00138e73:
            *ppNVar8 = node;
          }
          list->next = node;
          node->prev = list;
        }
        pLVar2->excludeBlocks = no;
        uStack_48 = 0x100000000;
        goto LAB_00138e0d;
      default:
        goto switchD_00138c88_caseD_1;
      case 3:
      case 6:
        break;
      case 5:
        BVar5 = prvTidyIsHTML5Mode(doc);
        if (BVar5 == no) goto switchD_00138c88_caseD_1;
      }
    }
    if (node->type != EndTag) {
      node->parent = list;
      if (list == (Node *)0x0) {
        node->prev = (Node *)0x0;
      }
      else {
        pNVar7 = list->last;
        node->prev = pNVar7;
        ppNVar8 = &pNVar7->next;
        if (pNVar7 == (Node *)0x0) {
          ppNVar8 = &list->content;
        }
        *ppNVar8 = node;
        list->last = node;
      }
      uStack_48 = 0;
LAB_00138e0d:
      prvTidypushMemory(doc,(TidyParserMemory)
                            ZEXT3248(CONCAT824(uStack_48,
                                               CONCAT816(node,CONCAT88(list,prvTidyParseDefList)))))
      ;
      return node;
    }
  }
  iVar9 = 0;
  prvTidyReport(doc,list,node,0x235);
  prvTidyFreeNode(doc,node);
  goto LAB_00138ac8;
}

Assistant:

Node* TY_(ParseDefList)( TidyDocImpl* doc, Node *list, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISCENTER,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);
    }

    if (list->tag->model & CM_EMPTY)
        return NULL;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)( doc, IgnoreWhitespace);
        
        switch ( state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }

                if (node->tag == list->tag && node->type == EndTag)
                {
                    TY_(FreeNode)( doc, node);
                    list->closed = yes;
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(list, node))
                    continue;

                if (TY_(nodeIsText)(node))
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DT);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    Bool discardIt = no;
                    if ( nodeIsFORM(node) )
                    {
                        BadForm( doc );
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    for (parent = list->parent;
                            parent != NULL; parent = parent->parent)
                    {
                       /* Do not match across BODY to avoid infinite loop
                          between ParseBody and this parser,
                          See http://tidy.sf.net/bug/1098012. */
                        if (nodeIsBODY(parent))
                        {
                            discardIt = yes;
                            break;
                        }
                        if (node->tag == parent->tag)
                        {
                            TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                            TY_(UngetToken)( doc );

                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                    if (discardIt)
                    {
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* center in a dt or a dl breaks the dl list in two */
                if ( nodeIsCENTER(node) )
                {
                    if (list->content)
                        TY_(InsertNodeAfterElement)(list, node);
                    else /* trim empty dl list */
                    {
                        TY_(InsertNodeBeforeElement)(list, node);
                    }

                    /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                                 Gary Dechaines 11 Aug 00 */
                    /* ParseTag can destroy node, if it finds that
                     * this <center> is followed immediately by </center>.
                     * It's awkward but necessary to determine if this
                     * has happened.
                     */
                    parent = node->parent;

                    /* and parse contents of center */
                    lexer->excludeBlocks = no;

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseDefList);
                        memory.original_node = list;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_POST_NODEISCENTER;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( !( nodeIsDT(node) || nodeIsDD(node) || ( nodeIsDIV(node) && TY_(IsHTML5Mode)(doc) ) ) )
                {
                    TY_(UngetToken)( doc );

                    if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
                    {
                        TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* if DD appeared directly in BODY then exclude blocks */
                    if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DD);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <DT> or <DD> or <DIV>*/
                TY_(InsertNodeAtEnd)(list, node);
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseDefList);
                    memory.original_node = list;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_INITIAL;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT;
                    return node;
                }
            } break;


            case STATE_POST_NODEISCENTER:
            {
                lexer->excludeBlocks = yes;

                /* now create a new dl element,
                 * unless node has been blown away because the
                 * center was empty, as above.
                 */
                if (parent && parent->last == node)
                {
                    list = TY_(InferredTag)(doc, TidyTag_DL);
                    TY_(InsertNodeAfterElement)(node, list);
                }
                state = STATE_INITIAL;
                continue;
            } break;


            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}